

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::rasterizer_cells_aa(rasterizer_cells_aa<agg::cell_aa> *this)

{
  int iVar1;
  rasterizer_cells_aa<agg::cell_aa> *this_local;
  
  this->m_num_blocks = 0;
  this->m_max_blocks = 0;
  this->m_curr_block = 0;
  this->m_num_cells = 0;
  this->m_cells = (cell_type **)0x0;
  this->m_curr_cell_ptr = (cell_type *)0x0;
  pod_vector<agg::cell_aa_*>::pod_vector(&this->m_sorted_cells);
  pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::pod_vector(&this->m_sorted_y);
  iVar1 = std::numeric_limits<int>::max();
  this->m_min_x = iVar1;
  iVar1 = std::numeric_limits<int>::max();
  this->m_min_y = iVar1;
  iVar1 = std::numeric_limits<int>::min();
  this->m_max_x = iVar1;
  iVar1 = std::numeric_limits<int>::min();
  this->m_max_y = iVar1;
  this->m_sorted = false;
  cell_aa::initial(&this->m_style_cell);
  cell_aa::initial(&this->m_curr_cell);
  return;
}

Assistant:

rasterizer_cells_aa<Cell>::rasterizer_cells_aa() :
        m_num_blocks(0),
        m_max_blocks(0),
        m_curr_block(0),
        m_num_cells(0),
        m_cells(0),
        m_curr_cell_ptr(0),
        m_sorted_cells(),
        m_sorted_y(),
        m_min_x(std::numeric_limits<int>::max()),
        m_min_y(std::numeric_limits<int>::max()),
        m_max_x(std::numeric_limits<int>::min()),
        m_max_y(std::numeric_limits<int>::min()),
        m_sorted(false)
    {
        m_style_cell.initial();
        m_curr_cell.initial();
    }